

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.hpp
# Opt level: O0

void __thiscall lattice::supercell::supercell(supercell *this,span_t *span)

{
  EVP_PKEY_CTX *in_RSI;
  supercell *in_RDI;
  
  Eigen::Matrix<long,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<long,__1,__1,_0,__1,__1> *)0x119276);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x119289);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x11929e);
  Eigen::Matrix<long,_-1,_1,_0,_-1,_1>::Matrix((Matrix<long,__1,_1,_0,__1,_1> *)0x1192b3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1192c7);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1192da);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

supercell(const span_t& span) { init(span); }